

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_object_data_finalizer(JSRuntime *rt,JSValue val)

{
  JSValueUnion JVar1;
  
  JVar1 = val.u;
  JS_FreeValueRT(rt,*(JSValue *)((long)JVar1.ptr + 0x30));
  *(undefined4 *)((long)JVar1.ptr + 0x30) = 0;
  *(undefined8 *)((long)JVar1.ptr + 0x38) = 3;
  return;
}

Assistant:

static void js_object_data_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JS_FreeValueRT(rt, p->u.object_data);
    p->u.object_data = JS_UNDEFINED;
}